

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-recv-in-a-row.c
# Opt level: O3

int run_test_udp_recv_in_a_row(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 *extraout_RDX;
  uv_check_t *puVar4;
  uv_buf_t uVar5;
  int64_t eval_b;
  int64_t eval_a;
  void *local_28;
  
  uVar3 = uv_default_loop();
  iVar1 = uv_check_init(uVar3,&check_handle);
  local_28 = (void *)(long)iVar1;
  if (local_28 == (void *)0x0) {
    iVar1 = uv_check_start(&check_handle,check_cb);
    local_28 = (void *)(long)iVar1;
    if (local_28 != (void *)0x0) goto LAB_001e32c2;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
    local_28 = (void *)(long)iVar1;
    if (local_28 != (void *)0x0) goto LAB_001e32d1;
    uVar3 = uv_default_loop();
    iVar1 = uv_udp_init(uVar3,&server);
    local_28 = (void *)(long)iVar1;
    if (local_28 != (void *)0x0) goto LAB_001e32e0;
    iVar1 = uv_udp_bind(&server,&addr,0);
    local_28 = (void *)(long)iVar1;
    if (local_28 != (void *)0x0) goto LAB_001e32ef;
    iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
    local_28 = (void *)(long)iVar1;
    if (local_28 != (void *)0x0) goto LAB_001e32fe;
    uVar3 = uv_default_loop();
    iVar1 = uv_udp_init(uVar3,&client);
    local_28 = (void *)(long)iVar1;
    if (local_28 != (void *)0x0) goto LAB_001e330d;
    buf = (uv_buf_t)uv_buf_init(send_data,10);
    iVar1 = 4;
    do {
      iVar2 = uv_udp_try_send(&client,&buf,1,&addr);
      local_28 = (void *)0xa;
      if (iVar2 != 10) {
        run_test_udp_recv_in_a_row_cold_8();
        goto LAB_001e32b3;
      }
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    uVar5 = (uv_buf_t)uv_buf_init(0,0);
    buf = uVar5;
    iVar1 = uv_udp_try_send(&client,&buf,1,&addr);
    local_28 = (void *)(long)iVar1;
    if (local_28 != (void *)0x0) goto LAB_001e331c;
    uVar3 = uv_default_loop();
    iVar1 = uv_run(uVar3,0);
    local_28 = (void *)(long)iVar1;
    if (local_28 != (void *)0x0) goto LAB_001e332b;
    if (check_cb_called == '\0') goto LAB_001e333a;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    uv_run(uVar3,0);
    local_28 = (void *)0x0;
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_close(uVar3);
    if (local_28 == (void *)(long)iVar1) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
LAB_001e32b3:
    run_test_udp_recv_in_a_row_cold_1();
LAB_001e32c2:
    run_test_udp_recv_in_a_row_cold_2();
LAB_001e32d1:
    run_test_udp_recv_in_a_row_cold_3();
LAB_001e32e0:
    run_test_udp_recv_in_a_row_cold_4();
LAB_001e32ef:
    run_test_udp_recv_in_a_row_cold_5();
LAB_001e32fe:
    run_test_udp_recv_in_a_row_cold_6();
LAB_001e330d:
    run_test_udp_recv_in_a_row_cold_7();
LAB_001e331c:
    run_test_udp_recv_in_a_row_cold_9();
LAB_001e332b:
    run_test_udp_recv_in_a_row_cold_10();
LAB_001e333a:
    run_test_udp_recv_in_a_row_cold_11();
  }
  puVar4 = (uv_check_t *)&stack0xffffffffffffffd8;
  run_test_udp_recv_in_a_row_cold_12();
  if (puVar4 == &check_handle) {
    if (recv_cnt == 6) {
      check_cb_called = '\x01';
      iVar1 = uv_check_stop(&check_handle);
      if (iVar1 == 0) {
        uv_close(&client,0);
        uv_close(&check_handle,0);
        iVar1 = uv_close(&server,0);
        return iVar1;
      }
      goto LAB_001e33f0;
    }
  }
  else {
    check_cb_cold_1();
  }
  check_cb_cold_2();
LAB_001e33f0:
  check_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 10;
  return 0x104f0fc;
}

Assistant:

TEST_IMPL(udp_recv_in_a_row) {
  int i, r;
  
  ASSERT_OK(uv_check_init(uv_default_loop(), &check_handle));
  ASSERT_OK(uv_check_start(&check_handle, check_cb));

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT_OK(uv_udp_init(uv_default_loop(), &server));
  ASSERT_OK(uv_udp_bind(&server, (const struct sockaddr*) &addr, 0));
  ASSERT_OK(uv_udp_recv_start(&server, alloc_cb, sv_recv_cb));

  ASSERT_OK(uv_udp_init(uv_default_loop(), &client));

  /* send N-1 udp packets */
  buf = uv_buf_init(send_data, sizeof(send_data));
  for (i = 0; i < N - 1; i ++) {
    r = uv_udp_try_send(&client,
                        &buf,
                        1,
                        (const struct sockaddr*) &addr);
    ASSERT_EQ(sizeof(send_data), r);
  }

  /* send an empty udp packet */
  buf = uv_buf_init(NULL, 0);
  r = uv_udp_try_send(&client,
                      &buf,
                      1,
                      (const struct sockaddr*) &addr);
  ASSERT_OK(r);

  /* check_cb() asserts that the N packets can be received
   * before it gets called. 
   */

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT(check_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}